

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

aiMesh * __thiscall Assimp::XGLImporter::ToOutputMesh(XGLImporter *this,TempMaterialMesh *m)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  _Head_base<0UL,_aiMesh_*,_false> _Var4;
  _Head_base<0UL,_aiMesh_*,_false> _Var5;
  aiVector3D *paVar6;
  long lVar7;
  ulong *puVar8;
  aiFace *paVar9;
  uint *puVar10;
  aiFace *paVar11;
  pointer __p;
  uint uVar12;
  ulong uVar13;
  uint i;
  size_t sVar14;
  ulong uVar15;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  _Head_base<0UL,_aiMesh_*,_false> local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  _Var5._M_head_impl = (aiMesh *)operator_new(0x520);
  (_Var5._M_head_impl)->mPrimitiveTypes = 0;
  (_Var5._M_head_impl)->mNumFaces = 0;
  local_48 = (pointer)&(_Var5._M_head_impl)->mVertices;
  memset(local_48,0,0xcc);
  (_Var5._M_head_impl)->mBones = (aiBone **)0x0;
  (_Var5._M_head_impl)->mMaterialIndex = 0;
  ((_Var5._M_head_impl)->mName).length = 0;
  ((_Var5._M_head_impl)->mName).data[0] = '\0';
  memset(((_Var5._M_head_impl)->mName).data + 1,0x1b,0x3ff);
  (_Var5._M_head_impl)->mNumAnimMeshes = 0;
  (_Var5._M_head_impl)->mAnimMeshes = (aiAnimMesh **)0x0;
  (_Var5._M_head_impl)->mMethod = 0;
  ((_Var5._M_head_impl)->mAABB).mMin.x = 0.0;
  ((_Var5._M_head_impl)->mAABB).mMin.y = 0.0;
  ((_Var5._M_head_impl)->mAABB).mMin.z = 0.0;
  ((_Var5._M_head_impl)->mAABB).mMax.x = 0.0;
  ((_Var5._M_head_impl)->mAABB).mMax.y = 0.0;
  ((_Var5._M_head_impl)->mAABB).mMax.z = 0.0;
  memset((_Var5._M_head_impl)->mColors,0,0xa0);
  local_38 = (m->positions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (m->positions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
  sVar14 = (long)local_40 - (long)local_38;
  uVar13 = ((long)sVar14 >> 2) * -0x5555555555555555;
  uVar12 = (uint)uVar13;
  (_Var5._M_head_impl)->mNumVertices = uVar12;
  uVar15 = (uVar13 & 0xffffffff) * 0xc;
  local_50._M_head_impl = _Var5._M_head_impl;
  paVar6 = (aiVector3D *)operator_new__(uVar15);
  if (uVar12 != 0) {
    memset(paVar6,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
  }
  *(aiVector3D **)local_48 = paVar6;
  if (local_40 != local_38) {
    memmove(paVar6,local_38,sVar14);
  }
  local_48 = (m->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  sVar14 = (long)(m->normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)local_48;
  if (sVar14 != 0) {
    paVar6 = (aiVector3D *)operator_new__(uVar15);
    if (uVar12 != 0) {
      memset(paVar6,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
    }
    (_Var5._M_head_impl)->mNormals = paVar6;
    memmove(paVar6,local_48,sVar14);
  }
  if ((m->uvs).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (m->uvs).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    (_Var5._M_head_impl)->mNumUVComponents[0] = 2;
    uVar15 = (uVar13 & 0xffffffff) * 0xc;
    paVar6 = (aiVector3D *)operator_new__(uVar15);
    if (uVar12 == 0) {
      (_Var5._M_head_impl)->mTextureCoords[0] = paVar6;
    }
    else {
      uVar13 = 0;
      memset(paVar6,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
      (_Var5._M_head_impl)->mTextureCoords[0] = paVar6;
      lVar7 = 8;
      do {
        paVar6 = (_Var5._M_head_impl)->mTextureCoords[0];
        *(aiVector2t<float> *)((long)paVar6 + lVar7 + -8) =
             (m->uvs).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar13];
        *(undefined4 *)((long)&paVar6->x + lVar7) = 0;
        uVar13 = uVar13 + 1;
        lVar7 = lVar7 + 0xc;
        _Var5._M_head_impl = local_50._M_head_impl;
      } while (uVar13 < (local_50._M_head_impl)->mNumVertices);
    }
  }
  (_Var5._M_head_impl)->mNumFaces =
       (uint)((ulong)((long)(m->vcounts).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(m->vcounts).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
  puVar2 = (m->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (m->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)puVar3 - (long)puVar2;
  uVar15 = lVar7 >> 2;
  puVar8 = (ulong *)operator_new__(-(ulong)(uVar15 >> 0x3c != 0) | lVar7 * 4 + 8U);
  *puVar8 = uVar15;
  paVar9 = (aiFace *)(puVar8 + 1);
  if (puVar3 != puVar2) {
    paVar11 = paVar9;
    do {
      paVar11->mNumIndices = 0;
      paVar11->mIndices = (uint *)0x0;
      paVar11 = paVar11 + 1;
    } while (paVar11 != paVar9 + uVar15);
  }
  (_Var5._M_head_impl)->mFaces = paVar9;
  if ((_Var5._M_head_impl)->mNumFaces == 0) {
    uVar12 = 0;
  }
  else {
    uVar15 = 0;
    uVar12 = 0;
    do {
      paVar9 = (_Var5._M_head_impl)->mFaces;
      uVar1 = (m->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15];
      paVar9[uVar15].mNumIndices = uVar1;
      puVar10 = (uint *)operator_new__((ulong)uVar1 << 2);
      paVar9 = paVar9 + uVar15;
      paVar9->mIndices = puVar10;
      if (paVar9->mNumIndices != 0) {
        uVar13 = 0;
        do {
          paVar9->mIndices[uVar13] = uVar12 + (int)uVar13;
          uVar13 = uVar13 + 1;
        } while (uVar13 < paVar9->mNumIndices);
        uVar12 = uVar12 + (int)uVar13;
      }
      uVar15 = uVar15 + 1;
      _Var5._M_head_impl = local_50._M_head_impl;
    } while (uVar15 < (local_50._M_head_impl)->mNumFaces);
  }
  _Var4._M_head_impl = local_50._M_head_impl;
  if (uVar12 != (_Var5._M_head_impl)->mNumVertices) {
    __assert_fail("idx == mesh->mNumVertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/XGL/XGLLoader.cpp"
                  ,0x235,"aiMesh *Assimp::XGLImporter::ToOutputMesh(const TempMaterialMesh &)");
  }
  (_Var5._M_head_impl)->mPrimitiveTypes = m->pflags;
  (local_50._M_head_impl)->mMaterialIndex = m->matid;
  local_50._M_head_impl = (aiMesh *)0x0;
  std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_50);
  return _Var4._M_head_impl;
}

Assistant:

aiMesh* XGLImporter::ToOutputMesh(const TempMaterialMesh& m)
{
    std::unique_ptr<aiMesh> mesh(new aiMesh());

    mesh->mNumVertices = static_cast<unsigned int>(m.positions.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy(m.positions.begin(),m.positions.end(),mesh->mVertices);

    if(m.normals.size()) {
        mesh->mNormals = new aiVector3D[mesh->mNumVertices];
        std::copy(m.normals.begin(),m.normals.end(),mesh->mNormals);
    }

    if(m.uvs.size()) {
        mesh->mNumUVComponents[0] = 2;
        mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];

        for(unsigned int i = 0; i < mesh->mNumVertices; ++i) {
            mesh->mTextureCoords[0][i] = aiVector3D(m.uvs[i].x,m.uvs[i].y,0.f);
        }
    }

    mesh->mNumFaces =  static_cast<unsigned int>(m.vcounts.size());
    mesh->mFaces = new aiFace[m.vcounts.size()];

    unsigned int idx = 0;
    for(unsigned int i = 0; i < mesh->mNumFaces; ++i) {
        aiFace& f = mesh->mFaces[i];
        f.mNumIndices = m.vcounts[i];
        f.mIndices = new unsigned int[f.mNumIndices];
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            f.mIndices[c] = idx++;
        }
    }

    ai_assert(idx == mesh->mNumVertices);

    mesh->mPrimitiveTypes = m.pflags;
    mesh->mMaterialIndex = m.matid;
    return mesh.release();
}